

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O3

void re2::Parse3CachedOnePass(int iters,char *regexp,StringPiece *text)

{
  bool bVar1;
  size_t sVar2;
  Regexp *this;
  Prog *this_00;
  long lVar3;
  StringPiece sp [4];
  StringPiece local_1f8 [4];
  LogMessage local_1b0;
  
  local_1b0._0_8_ = regexp;
  if (regexp == (char *)0x0) {
    local_1b0._8_4_ = 0;
  }
  else {
    sVar2 = strlen(regexp);
    local_1b0._8_4_ = SUB84(sVar2,0);
  }
  this = Regexp::Parse((StringPiece *)&local_1b0,LikePerl,(RegexpStatus *)0x0);
  if (this == (Regexp *)0x0) {
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x46f,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1b0 + 8),"Check failed: re",0x10);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
  }
  this_00 = Regexp::CompileToProg(this,0);
  if (this_00 == (Prog *)0x0) {
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x471,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1b0 + 8),"Check failed: prog",0x12);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
  }
  bVar1 = Prog::IsOnePass(this_00);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x472,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1b0 + 8),"Check failed: prog->IsOnePass()",0x1f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
  }
  lVar3 = 0;
  do {
    *(undefined8 *)((long)&local_1f8[0].ptr_ + lVar3) = 0;
    *(undefined4 *)((long)&local_1f8[0].length_ + lVar3) = 0;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x40);
  if (0 < iters) {
    do {
      bVar1 = Prog::SearchOnePass(this_00,text,text,kAnchored,kFullMatch,local_1f8,4);
      if (!bVar1) {
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                   ,0x475,3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((long)&local_1b0 + 8),
                   "Check failed: prog->SearchOnePass(text, text, Prog::kAnchored, Prog::kFullMatch, sp, 4)"
                   ,0x57);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
      }
      iters = iters + -1;
    } while (iters != 0);
  }
  Prog::~Prog(this_00);
  operator_delete(this_00);
  Regexp::Decref(this);
  return;
}

Assistant:

void Parse3CachedOnePass(int iters, const char* regexp, const StringPiece& text) {
  Regexp* re = Regexp::Parse(regexp, Regexp::LikePerl, NULL);
  CHECK(re);
  Prog* prog = re->CompileToProg(0);
  CHECK(prog);
  CHECK(prog->IsOnePass());
  StringPiece sp[4];  // 4 because sp[0] is whole match.
  for (int i = 0; i < iters; i++)
    CHECK(prog->SearchOnePass(text, text, Prog::kAnchored, Prog::kFullMatch, sp, 4));
  delete prog;
  re->Decref();
}